

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_operator_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,OperatorExpression *op,
          idx_t depth)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_00;
  ExpressionType EVar1;
  allocator aVar2;
  pointer puVar3;
  bool bVar4;
  LogicalTypeId LVar5;
  int iVar6;
  reference pvVar7;
  pointer pEVar8;
  BoundConstantExpression *pBVar9;
  type pPVar10;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar11;
  reference pvVar12;
  pointer pBVar13;
  ParameterNotResolvedException *this_01;
  BinderException *pBVar14;
  uint *params;
  char *params_00;
  idx_t i;
  ulong uVar15;
  pointer __args;
  idx_t i_1;
  LogicalType *this_02;
  string *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  BindResult *pBVar16;
  allocator local_311;
  BindResult *local_310;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2e8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2e0;
  Value local_2d8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_298;
  char *local_290;
  string function_name;
  LogicalType result_type;
  string local_250;
  string local_230 [32];
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0;
  string local_1b0 [32];
  string local_190;
  string local_170 [32];
  string local_150;
  ErrorData error;
  ErrorData local_b0;
  
  if ((op->super_ParsedExpression).super_BaseExpression.type == GROUPING_FUNCTION) {
    (*this->_vptr_ExpressionBinder[7])(__return_storage_ptr__,this,op,depth);
    return __return_storage_ptr__;
  }
  local_310 = __return_storage_ptr__;
  ErrorData::ErrorData(&error);
  this_00 = &op->children;
  for (uVar15 = 0;
      uVar15 < (ulong)((long)(op->children).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(op->children).
                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1) {
    pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(this_00,uVar15);
    BindChild(this,pvVar7,depth,&error);
  }
  if (error.initialized != false) {
    ErrorData::ErrorData(&local_b0,&error);
    pBVar16 = local_310;
    BindResult::BindResult(local_310,&local_b0);
    ErrorData::~ErrorData(&local_b0);
    goto LAB_015eff35;
  }
  function_name._M_dataplus._M_p = (pointer)&function_name.field_2;
  function_name._M_string_length = 0;
  function_name.field_2._M_local_buf[0] = '\0';
  EVar1 = (op->super_ParsedExpression).super_BaseExpression.type;
  params = &switchD_015ef8af::switchdataD_0200a254;
  switch(EVar1) {
  case ARRAY_EXTRACT:
    pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(this_00,0);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar7);
    puVar11 = BoundExpression::GetExpression(pPVar10);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    if ((((pEVar8->return_type).id_ == MAP) ||
        (bVar4 = LogicalType::IsJSONType(&pEVar8->return_type), !bVar4)) ||
       ((long)(op->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(op->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x10)) {
      ::std::__cxx11::string::assign((char *)&function_name);
    }
    else {
      ::std::__cxx11::string::assign((char *)&function_name);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(this_00,1);
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(pvVar7);
      puVar11 = BoundExpression::GetExpression(pPVar10);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar11);
      if ((pEVar8->super_BaseExpression).expression_class == BOUND_CONSTANT) {
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(puVar11);
        pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                           (&pEVar8->super_BaseExpression);
        if ((pBVar9->value).is_null == false) {
          ::std::__cxx11::string::string(local_170,"$[%s]",(allocator *)&children);
          Value::ToString_abi_cxx11_((string *)(local_1b0 + 0x20),&pBVar9->value);
          StringUtil::Format<std::__cxx11::string>
                    (&local_150,(StringUtil *)local_170,(string *)(local_1b0 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)params);
          Value::Value(&local_2d8,&local_150);
          Value::operator=(&pBVar9->value,&local_2d8);
          Value::~Value(&local_2d8);
          ::std::__cxx11::string::~string((string *)&local_150);
          ::std::__cxx11::string::~string(local_1b0 + 0x20);
          ::std::__cxx11::string::~string(local_170);
          LogicalType::LogicalType(&local_2d8.type_,VARCHAR);
LAB_015efd1f:
          LogicalType::operator=(&(pBVar9->super_Expression).return_type,&local_2d8.type_);
          LogicalType::~LogicalType(&local_2d8.type_);
        }
      }
    }
    break;
  case ARRAY_SLICE:
    goto LAB_015efa1e;
  case STRUCT_EXTRACT:
    pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(this_00,0);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar7);
    puVar11 = BoundExpression::GetExpression(pPVar10);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[6])(pEVar8);
    if (((char)iVar6 != '\0') ||
       (pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(puVar11), (pEVar8->return_type).id_ == UNKNOWN)) {
      this_01 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      ParameterNotResolvedException::ParameterNotResolvedException(this_01);
      __cxa_throw(this_01,&ParameterNotResolvedException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(this_00,1);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar7);
    local_298 = BoundExpression::GetExpression(pPVar10);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    this_02 = &pEVar8->return_type;
    LVar5 = (pEVar8->return_type).id_;
    params_00 = "union_extract";
    local_290 = "union_extract";
    if (LVar5 == SQLNULL) goto LAB_015ef9ee;
    if (LVar5 == STRUCT) {
LAB_015efc1a:
      bVar4 = LogicalType::IsJSONType(this_02);
      if (bVar4) {
        ::std::__cxx11::string::assign((char *)&function_name);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(local_298);
        if ((pEVar8->super_BaseExpression).expression_class == BOUND_CONSTANT) {
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->(local_298);
          pBVar9 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                             (&pEVar8->super_BaseExpression);
          if ((pBVar9->value).is_null == false) {
            ::std::__cxx11::string::string(local_230,"$.\"%s\"",(allocator *)&children);
            Value::ToString_abi_cxx11_(&local_250,&pBVar9->value);
            StringUtil::Format<std::__cxx11::string>
                      (&local_210,(StringUtil *)local_230,&local_250,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       params_00);
            Value::Value(&local_2d8,&local_210);
            Value::operator=(&pBVar9->value,&local_2d8);
            Value::~Value(&local_2d8);
            ::std::__cxx11::string::~string((string *)&local_210);
            ::std::__cxx11::string::~string((string *)&local_250);
            ::std::__cxx11::string::~string(local_230);
            LogicalType::LogicalType(&local_2d8.type_,VARCHAR);
            goto LAB_015efd1f;
          }
        }
        break;
      }
      local_290 = "struct_extract";
    }
    else if (LVar5 == MAP) {
LAB_015ef9ee:
      if (LVar5 != UNION) {
        if (LVar5 != MAP) goto LAB_015efc1a;
        local_290 = "map_extract_value";
      }
    }
    else if (LVar5 != UNION) {
      bVar4 = LogicalType::IsJSONType(this_02);
      if (!bVar4) {
        ::std::__cxx11::string::string
                  (local_1b0,
                   "Cannot extract field %s from expression \"%s\" because it is not a struct, union, map, or json"
                   ,(allocator *)&children);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(local_298);
        (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[8])(&local_1d0,pEVar8);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(puVar11);
        (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[8])(&local_1f0,pEVar8);
        StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)&local_2d8,(StringUtil *)local_1b0,&local_1d0,&local_1f0,in_R8);
        BindResult::BindResult(local_310,(string *)&local_2d8);
        ::std::__cxx11::string::~string((string *)&local_2d8);
        ::std::__cxx11::string::~string((string *)&local_1f0);
        ::std::__cxx11::string::~string((string *)&local_1d0);
        this_03 = local_1b0;
        goto LAB_015ef91c;
      }
      LVar5 = this_02->id_;
      goto LAB_015ef9ee;
    }
    ::std::__cxx11::string::assign((char *)&function_name);
    break;
  case ARRAY_CONSTRUCTOR:
    goto LAB_015efa1e;
  case ARROW:
LAB_015efa1e:
    ::std::__cxx11::string::assign((char *)&function_name);
    break;
  case OPERATOR_TRY:
    pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(this_00,0);
    pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(pvVar7);
    puVar11 = BoundExpression::GetExpression(pPVar10);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[4])(pEVar8);
    if ((char)iVar6 != '\0') {
      pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_2d8,"TRY can not be used in combination with a scalar subquery",
                 (allocator *)&children);
      BinderException::BinderException(pBVar14,(string *)&local_2d8);
      __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(puVar11);
    iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar8);
    if ((char)iVar6 != '\0') {
      pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_2d8,"TRY can not be used in combination with a volatile function",
                 (allocator *)&children);
      BinderException::BinderException(pBVar14,(string *)&local_2d8);
      __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  default:
    if (EVar1 != OPERATOR_UNPACK) goto LAB_015efdb3;
    ::std::__cxx11::string::string
              ((string *)&local_2d8,"UNPACK not allowed here, should have been resolved earlier",
               (allocator *)&children);
    BindResult::BindResult(local_310,(string *)&local_2d8);
    this_03 = (string *)&local_2d8;
LAB_015ef91c:
    ::std::__cxx11::string::~string(this_03);
    goto LAB_015eff23;
  }
  if (function_name._M_string_length == 0) {
LAB_015efdb3:
    children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    children.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar15 = 0;
        uVar15 < (ulong)((long)(op->children).
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(op->children).
                               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1)
    {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::get<true>(this_00,uVar15);
      pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(pvVar7);
      puVar11 = BoundExpression::GetExpression(pPVar10);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&children,puVar11);
    }
    ResolveOperatorType(&result_type,this,op,&children);
    aVar2 = (allocator)(op->super_ParsedExpression).super_BaseExpression.type;
    if (aVar2 == (allocator)0x98) {
      if (children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_2d8,"COALESCE needs at least one child",&local_311);
        BinderException::BinderException(pBVar14,(string *)&local_2d8);
        __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((long)children.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)children.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) goto LAB_015efe7f;
      pvVar12 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::get<true>(&children,0);
      local_2e0._M_head_impl =
           (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (pvVar12->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      BindResult::BindResult
                (local_310,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_2e0);
      if (local_2e0._M_head_impl != (Expression *)0x0) {
        (*((local_2e0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_2e0._M_head_impl = (Expression *)0x0;
    }
    else {
LAB_015efe7f:
      local_311 = aVar2;
      make_uniq<duckdb::BoundOperatorExpression,duckdb::ExpressionType,duckdb::LogicalType&>
                ((duckdb *)&local_2d8,(ExpressionType *)&local_311,&result_type);
      puVar3 = children.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__args = children.
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_2e8._M_head_impl = (Expression *)local_2d8.type_._0_8_, __args != puVar3;
          __args = __args + 1) {
        pBVar13 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                                *)&local_2d8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar13->children,__args);
      }
      local_2d8.type_._0_8_ = (pointer)0x0;
      BindResult::BindResult
                (local_310,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_2e8);
      if (local_2e8._M_head_impl != (Expression *)0x0) {
        (*((local_2e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      local_2e8._M_head_impl = (Expression *)0x0;
      if ((pointer)local_2d8.type_._0_8_ != (pointer)0x0) {
        (**(code **)(*(long *)local_2d8.type_._0_8_ + 8))();
      }
    }
    LogicalType::~LogicalType(&result_type);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&children);
  }
  else {
    make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_2d8,&function_name,this_00);
    (*this->_vptr_ExpressionBinder[5])(local_310,this,&local_2d8,depth,0);
    if ((pointer)local_2d8.type_._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_2d8.type_._0_8_ + 8))();
    }
  }
LAB_015eff23:
  ::std::__cxx11::string::~string((string *)&function_name);
  pBVar16 = local_310;
LAB_015eff35:
  ErrorData::~ErrorData(&error);
  return pBVar16;
}

Assistant:

BindResult ExpressionBinder::BindExpression(OperatorExpression &op, idx_t depth) {
	if (op.GetExpressionType() == ExpressionType::GROUPING_FUNCTION) {
		return BindGroupingFunction(op, depth);
	}

	// Bind the children of the operator expression. We already create bound expressions.
	// Only those children that trigger an error are not yet bound.
	ErrorData error;
	for (idx_t i = 0; i < op.children.size(); i++) {
		BindChild(op.children[i], depth, error);
	}
	if (error.HasError()) {
		return BindResult(std::move(error));
	}

	// all children bound successfully
	string function_name;
	switch (op.GetExpressionType()) {
	case ExpressionType::OPERATOR_UNPACK:
		return BindResult("UNPACK not allowed here, should have been resolved earlier");
	case ExpressionType::ARRAY_EXTRACT: {
		D_ASSERT(op.children[0]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &b_exp = BoundExpression::GetExpression(*op.children[0]);
		const auto &b_exp_type = b_exp->return_type;
		if (b_exp_type.id() == LogicalTypeId::MAP) {
			function_name = "map_extract_value";
		} else if (b_exp_type.IsJSONType() && op.children.size() == 2) {
			function_name = "json_extract";
			// Make sure we only extract array elements, not fields, by adding the $[] syntax
			auto &i_exp = BoundExpression::GetExpression(*op.children[1]);
			if (i_exp->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
				auto &const_exp = i_exp->Cast<BoundConstantExpression>();
				if (!const_exp.value.IsNull()) {
					const_exp.value = StringUtil::Format("$[%s]", const_exp.value.ToString());
					const_exp.return_type = LogicalType::VARCHAR;
				}
			}
		} else {
			function_name = "array_extract";
		}
		break;
	}
	case ExpressionType::ARRAY_SLICE:
		function_name = "array_slice";
		break;
	case ExpressionType::STRUCT_EXTRACT: {
		D_ASSERT(op.children.size() == 2);
		D_ASSERT(op.children[0]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		D_ASSERT(op.children[1]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		auto &extract_exp = BoundExpression::GetExpression(*op.children[0]);
		if (extract_exp->HasParameter() || extract_exp->return_type.id() == LogicalTypeId::UNKNOWN) {
			throw ParameterNotResolvedException();
		}
		auto &name_exp = BoundExpression::GetExpression(*op.children[1]);
		const auto &extract_expr_type = extract_exp->return_type;
		if (extract_expr_type.id() != LogicalTypeId::STRUCT && extract_expr_type.id() != LogicalTypeId::UNION &&
		    extract_expr_type.id() != LogicalTypeId::MAP && extract_expr_type.id() != LogicalTypeId::SQLNULL &&
		    !extract_expr_type.IsJSONType()) {
			return BindResult(StringUtil::Format(
			    "Cannot extract field %s from expression \"%s\" because it is not a struct, union, map, or json",
			    name_exp->ToString(), extract_exp->ToString()));
		}
		if (extract_expr_type.id() == LogicalTypeId::UNION) {
			function_name = "union_extract";
		} else if (extract_expr_type.id() == LogicalTypeId::MAP) {
			function_name = "map_extract_value";
		} else if (extract_expr_type.IsJSONType()) {
			function_name = "json_extract";
			// Make sure we only extract fields, not array elements, by adding $. syntax
			if (name_exp->GetExpressionClass() == ExpressionClass::BOUND_CONSTANT) {
				auto &const_exp = name_exp->Cast<BoundConstantExpression>();
				if (!const_exp.value.IsNull()) {
					const_exp.value = StringUtil::Format("$.\"%s\"", const_exp.value.ToString());
					const_exp.return_type = LogicalType::VARCHAR;
				}
			}
		} else {
			function_name = "struct_extract";
		}
		break;
	}
	case ExpressionType::ARRAY_CONSTRUCTOR:
		function_name = "list_value";
		break;
	case ExpressionType::ARROW:
		function_name = "json_extract";
		break;
	case ExpressionType::OPERATOR_TRY: {
		auto &expr = BoundExpression::GetExpression(*op.children[0]);
		if (expr->HasSubquery()) {
			throw BinderException("TRY can not be used in combination with a scalar subquery");
		}
		if (expr->IsVolatile()) {
			throw BinderException("TRY can not be used in combination with a volatile function");
		}
		break;
	}
	default:
		break;
	}
	if (!function_name.empty()) {
		auto function = make_uniq_base<ParsedExpression, FunctionExpression>(function_name, std::move(op.children));
		return BindExpression(function, depth, false);
	}

	vector<unique_ptr<Expression>> children;
	for (idx_t i = 0; i < op.children.size(); i++) {
		D_ASSERT(op.children[i]->GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION);
		children.push_back(std::move(BoundExpression::GetExpression(*op.children[i])));
	}
	// now resolve the types
	LogicalType result_type = ResolveOperatorType(op, children);
	if (op.GetExpressionType() == ExpressionType::OPERATOR_COALESCE) {
		if (children.empty()) {
			throw BinderException("COALESCE needs at least one child");
		}
		if (children.size() == 1) {
			return BindResult(std::move(children[0]));
		}
	}

	auto result = make_uniq<BoundOperatorExpression>(op.GetExpressionType(), result_type);
	for (auto &child : children) {
		result->children.push_back(std::move(child));
	}
	return BindResult(std::move(result));
}